

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogTreeView::keyPressEvent(QFileDialogTreeView *this,QKeyEvent *e)

{
  bool bVar1;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QKeyEvent *in_RDI;
  QKeyEvent *unaff_retaddr;
  
  __fd = (int)in_RSI;
  bVar1 = QFileDialogPrivate::itemViewKeyboardEvent((QFileDialogPrivate *)e,unaff_retaddr);
  __addr = extraout_RDX;
  if (!bVar1) {
    __fd = (int)in_RSI;
    QTreeView::keyPressEvent((QTreeView *)unaff_retaddr,in_RDI);
    __addr = extraout_RDX_00;
  }
  QEvent::accept(in_RSI,__fd,__addr,in_RCX);
  return;
}

Assistant:

void QFileDialogTreeView::keyPressEvent(QKeyEvent *e)
{
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplication::navigationMode() == Qt::NavigationModeKeypadDirectional) {
        QTreeView::keyPressEvent(e);
        return;
    }
#endif // QT_KEYPAD_NAVIGATION

    if (!d_ptr->itemViewKeyboardEvent(e))
        QTreeView::keyPressEvent(e);
    e->accept();
}